

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void __thiscall duckdb::FSSTCompressionState::AddNull(FSSTCompressionState *this)

{
  atomic<unsigned_long> *paVar1;
  bool bVar2;
  pointer pCVar3;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  bVar2 = HasEnoughSpace(this,0);
  if (!bVar2) {
    Flush(this,false);
    bVar2 = HasEnoughSpace(this,0);
    if (!bVar2) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "FSST string compression failed due to insufficient space in empty block",&local_39
                );
      InternalException::InternalException(this_00,&local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_38._M_dataplus._M_p._0_4_ = 0;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (uint *)&local_38);
  pCVar3 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar3->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void AddNull() {
		if (!HasEnoughSpace(0)) {
			Flush();
			if (!HasEnoughSpace(0)) {
				throw InternalException("FSST string compression failed due to insufficient space in empty block");
			};
		}
		index_buffer.push_back(0);
		current_segment->count++;
	}